

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_connection::received_piece(peer_connection *this,piece_index_t index)

{
  bool bVar1;
  uint uVar2;
  const_iterator local_70;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_68;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *local_60;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_58;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *local_50;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *local_48;
  const_iterator local_40;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_38;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *local_30;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_28;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_20;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  i;
  peer_connection *this_local;
  piece_index_t index_local;
  
  i._M_current = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)this;
  this_local._4_4_ = index.m_val;
  uVar2 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])();
  if ((uVar2 & 1) == 0) {
    uVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)((long)&this_local + 4));
    peer_log(this,incoming,"RECEIVED","piece: %d",(ulong)uVar2);
    local_28._M_current =
         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
         ::std::
         vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
         ::begin(&(this->m_suggested_pieces).
                  super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                );
    local_30 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
               ::std::
               vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
               ::end(&(this->m_suggested_pieces).
                      super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                    );
    local_20 = ::std::
               find<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>
                         (local_28,(__normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                                    )local_30,
                          (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                          ((long)&this_local + 4));
    local_38._M_current =
         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
         ::std::
         vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
         ::end(&(this->m_suggested_pieces).
                super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
              );
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_38);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
      ::
      __normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*>
                ((__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
                  *)&local_40,&local_20);
      local_48 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                 ::std::
                 vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 ::erase(&(this->m_suggested_pieces).
                          super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                         ,local_40);
    }
    local_58._M_current =
         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
         ::std::
         vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
         ::begin(&this->m_allowed_fast);
    local_60 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
               ::std::
               vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
               ::end(&this->m_allowed_fast);
    local_50 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
               ::std::
               find<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>
                         (local_58,(__normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                                    )local_60,
                          (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                          ((long)&this_local + 4));
    local_20 = (__normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                )local_50;
    local_68._M_current =
         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
         ::std::
         vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
         ::end(&this->m_allowed_fast);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_68);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
      ::
      __normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*>
                ((__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
                  *)&local_70,&local_20);
      ::std::
      vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      ::erase(&this->m_allowed_fast,local_70);
    }
    bVar1 = has_piece(this,this_local._4_4_);
    if (bVar1) {
      update_interest(this);
      uVar2 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
      if ((uVar2 & 1) != 0) {
        return;
      }
    }
    disconnect_if_redundant(this);
  }
  return;
}

Assistant:

void peer_connection::received_piece(piece_index_t const index)
	{
		TORRENT_ASSERT(is_single_thread());
		// dont announce during handshake
		if (in_handshake()) return;

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::incoming, "RECEIVED", "piece: %d"
			, static_cast<int>(index));
#endif

		// remove suggested pieces once we have them
		auto i = std::find(m_suggested_pieces.begin(), m_suggested_pieces.end(), index);
		if (i != m_suggested_pieces.end()) m_suggested_pieces.erase(i);

		// remove allowed fast pieces
		i = std::find(m_allowed_fast.begin(), m_allowed_fast.end(), index);
		if (i != m_allowed_fast.end()) m_allowed_fast.erase(i);

		if (has_piece(index))
		{
			// if we got a piece that this peer has
			// it might have been the last interesting
			// piece this peer had. We might not be
			// interested anymore
			update_interest();
			if (is_disconnecting()) return;
		}

		if (disconnect_if_redundant()) return;

#if TORRENT_USE_ASSERTS
		auto t = m_torrent.lock();
		TORRENT_ASSERT(t);
#endif
	}